

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t state_set_field_name(apx_vm_writeState_t *self,char *name,_Bool is_last_field)

{
  adt_error_t error_code;
  _Bool is_last_field_local;
  char *name_local;
  apx_vm_writeState_t *self_local;
  
  if (self != (apx_vm_writeState_t *)0x0) {
    if (name == (char *)0x0) {
      self_local._4_4_ = 0x24;
    }
    else {
      self->is_last_field = is_last_field;
      error_code = adt_str_set_cstr(&self->field_name,name);
      self_local._4_4_ = convert_from_adt_to_apx_error(error_code);
    }
    return self_local._4_4_;
  }
  __assert_fail("self != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                ,0x4f6,
                "apx_error_t state_set_field_name(apx_vm_writeState_t *, const char *, _Bool)");
}

Assistant:

static apx_error_t state_set_field_name(apx_vm_readState_t* self, char const* name, bool is_last_field)
{
   if ((self != NULL) && (name != NULL))
   {
      apx_error_t retval = APX_NO_ERROR;
      adt_error_t rc;
      self->is_last_field = is_last_field;
      rc = adt_str_set_cstr(&self->field_name, name);
      if (rc != ADT_NO_ERROR)
      {
         retval = convert_from_adt_to_apx_error(rc);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}